

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O1

void __thiscall cppjieba::DictTrie::LoadDict(DictTrie *this,string *filePath)

{
  double weight;
  pointer word;
  char cVar1;
  ostream *poVar2;
  istream *piVar3;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buf;
  DictUnit node_info;
  ifstream ifs;
  string local_478;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_458;
  DictUnit local_438;
  undefined1 *local_3b8 [2];
  undefined1 local_3a8 [368];
  long local_238 [65];
  
  std::ifstream::ifstream((istream *)local_238,(filePath->_M_dataplus)._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    limonp::Logger::Logger
              ((Logger *)local_3b8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/DictTrie.hpp"
               ,0xcb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b8,"exp: [ifs.is_open()",0x13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"] false. ",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"open ",5);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_3b8,(filePath->_M_dataplus)._M_p,filePath->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," failed.",8);
    limonp::Logger::~Logger((Logger *)local_3b8);
  }
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  local_478._M_string_length = 0;
  local_478.field_2._M_local_buf[0] = '\0';
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_458.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438.word.ptr_ = (uint *)&local_438;
  local_438.word.size_ = 0;
  local_438.word.capacity_ = 0x10;
  local_438.tag._M_dataplus._M_p = (pointer)&local_438.tag.field_2;
  local_438.tag._M_string_length = 0;
  local_438.tag.field_2._M_local_buf[0] = '\0';
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_478,cVar1);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    local_3b8[0] = &((Logger *)local_3b8)->field_0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8," ","");
    limonp::Split(&local_478,&local_458,(string *)local_3b8,0xffffffffffffffff);
    if (local_3b8[0] != &((Logger *)local_3b8)->field_0x10) {
      operator_delete(local_3b8[0]);
    }
    if ((long)local_458.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_458.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x60) {
      limonp::Logger::Logger
                ((Logger *)local_3b8,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/DictTrie.hpp"
                 ,0xd2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b8,"exp: [buf.size() == DICT_COLUMN_NUM",0x23);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b8,"] false. ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b8,"split result illegal, line:",0x1b);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b8,local_478._M_dataplus._M_p,local_478._M_string_length);
      limonp::Logger::~Logger((Logger *)local_3b8);
    }
    word = local_458.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    weight = atof(local_458.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    MakeNodeInfo(this,&local_438,word,weight,word + 2);
    std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::push_back
              (&this->static_node_infos_,&local_438);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438.tag._M_dataplus._M_p != &local_438.tag.field_2) {
    operator_delete(local_438.tag._M_dataplus._M_p);
  }
  if ((DictUnit *)local_438.word.ptr_ != &local_438) {
    free(local_438.word.ptr_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_458);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void LoadDict(const string& filePath) {
    ifstream ifs(filePath.c_str());
    XCHECK(ifs.is_open()) << "open " << filePath << " failed.";
    string line;
    vector<string> buf;

    DictUnit node_info;
    for (size_t lineno = 0; getline(ifs, line); lineno++) {
      Split(line, buf, " ");
      XCHECK(buf.size() == DICT_COLUMN_NUM) << "split result illegal, line:" << line;
      MakeNodeInfo(node_info, 
            buf[0], 
            atof(buf[1].c_str()), 
            buf[2]);
      static_node_infos_.push_back(node_info);
    }
  }